

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O0

void __thiscall
TestPluginManager_requestUnlistedPlugin_Test::TestBody
          (TestPluginManager_requestUnlistedPlugin_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_140;
  Message local_138;
  shared_ptr<plugin::interfaces::IGeneratorManager> local_130;
  void *local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  Message local_100 [2];
  PluginError *anon_var_0;
  type e;
  shared_ptr<plugin::interfaces::IGeneratorManager> local_c0;
  byte local_a9;
  undefined1 auStack_a8 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  PluginManager pm;
  TestPluginManager_requestUnlistedPlugin_Test *this_local;
  
  pm._48_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"pluginlist_onlyone.pb.txt",&local_69);
  plugin::PluginManager::PluginManager((PluginManager *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_a8[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffff59 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_a8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_a8);
  if (bVar1) {
    local_a9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      plugin::helpers::
      GetSinglePlugin<plugin::interfaces::IGeneratorManager,plugin::interfaces::IGeneratorManager>
                ((helpers *)&local_c0,(PluginManager *)local_48);
      std::shared_ptr<plugin::interfaces::IGeneratorManager>::~shared_ptr(&local_c0);
    }
    if ((local_a9 & 1) != 0) goto LAB_0013f08d;
    std::__cxx11::string::operator=
              ((string *)auStack_a8,
               "Expected: plugin::helpers::GetSinglePlugin<plugin::interfaces::IGeneratorManager>(pm) throws an exception of type plugin::exceptions::PluginError.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_100);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
             ,0x73,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_100);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_100);
LAB_0013f08d:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_a8);
  local_120 = (void *)0x0;
  plugin::helpers::
  GetOptionalPlugin<plugin::interfaces::IGeneratorManager,plugin::interfaces::IGeneratorManager>
            ((helpers *)&local_130,(PluginManager *)local_48);
  testing::internal::EqHelper::
  Compare<std::nullptr_t,_std::shared_ptr<plugin::interfaces::IGeneratorManager>,_nullptr>
            ((EqHelper *)local_118,"nullptr",
             "plugin::helpers::GetOptionalPlugin<plugin::interfaces::IGeneratorManager>(pm)",
             &local_120,&local_130);
  std::shared_ptr<plugin::interfaces::IGeneratorManager>::~shared_ptr(&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  plugin::PluginManager::~PluginManager((PluginManager *)local_48);
  return;
}

Assistant:

TEST(TestPluginManager, requestUnlistedPlugin)
{
    plugin::PluginManager pm("pluginlist_onlyone.pb.txt");

    // Get plugin that doesn't exist, ensure exception thrown
    EXPECT_THROW(plugin::helpers::GetSinglePlugin<plugin::interfaces::IGeneratorManager>(pm), plugin::exceptions::PluginError);

    // Get plugin that doesn't exist, ensure no exception thrown
    EXPECT_EQ(nullptr, plugin::helpers::GetOptionalPlugin<plugin::interfaces::IGeneratorManager>(pm));
}